

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode ExtensionObject_decodeBinary(UA_ExtensionObject *dst,UA_DataType *_)

{
  UA_StatusCode UVar1;
  uint local_44;
  undefined1 auStack_40 [4];
  UA_StatusCode retval;
  UA_NodeId typeId;
  UA_Byte encoding;
  UA_DataType *__local;
  UA_ExtensionObject *dst_local;
  
  typeId.identifier.guid.data4[7] = '\0';
  UA_NodeId_init((UA_NodeId *)auStack_40);
  UVar1 = NodeId_decodeBinary((UA_NodeId *)auStack_40,(UA_DataType *)0x0);
  local_44 = Byte_decodeBinary(typeId.identifier.guid.data4 + 7,(UA_DataType *)0x0);
  local_44 = local_44 | UVar1;
  if (retval != 0) {
    local_44 = 0x80070000;
  }
  if (local_44 == 0) {
    if (typeId.identifier.guid.data4[7] == '\x01') {
      local_44 = ExtensionObject_decodeBinaryContent(dst,(UA_NodeId *)auStack_40);
    }
    else if (typeId.identifier.guid.data4[7] == '\0') {
      dst->encoding = UA_EXTENSIONOBJECT_ENCODED_NOBODY;
      (dst->content).decoded.type = (UA_DataType *)CONCAT44(retval,auStack_40);
      (dst->content).decoded.data = (void *)typeId._0_8_;
      *(size_t *)((long)&dst->content + 0x10) = typeId.identifier.string.length;
      (dst->content).encoded.body.length = 0;
      (dst->content).encoded.body.data = (UA_Byte *)0x0;
    }
    else if (typeId.identifier.guid.data4[7] == '\x02') {
      dst->encoding = UA_EXTENSIONOBJECT_ENCODED_XML;
      (dst->content).decoded.type = (UA_DataType *)CONCAT44(retval,auStack_40);
      (dst->content).decoded.data = (void *)typeId._0_8_;
      *(size_t *)((long)&dst->content + 0x10) = typeId.identifier.string.length;
      local_44 = ByteString_decodeBinary(&(dst->content).encoded.body);
    }
    else {
      local_44 = 0x80070000;
    }
    dst_local._4_4_ = local_44;
  }
  else {
    UA_NodeId_deleteMembers((UA_NodeId *)auStack_40);
    dst_local._4_4_ = local_44;
  }
  return dst_local._4_4_;
}

Assistant:

static UA_StatusCode
ExtensionObject_decodeBinary(UA_ExtensionObject *dst, const UA_DataType *_) {
    UA_Byte encoding = 0;
    UA_NodeId typeId;
    UA_NodeId_init(&typeId);
    UA_StatusCode retval = NodeId_decodeBinary(&typeId, NULL);
    retval |= Byte_decodeBinary(&encoding, NULL);
    if(typeId.identifierType != UA_NODEIDTYPE_NUMERIC)
        retval = UA_STATUSCODE_BADDECODINGERROR;
    if(retval != UA_STATUSCODE_GOOD) {
        UA_NodeId_deleteMembers(&typeId);
        return retval;
    }

    if(encoding == UA_EXTENSIONOBJECT_ENCODED_BYTESTRING) {
        retval = ExtensionObject_decodeBinaryContent(dst, &typeId);
    } else if(encoding == UA_EXTENSIONOBJECT_ENCODED_NOBODY) {
        dst->encoding = (UA_ExtensionObjectEncoding)encoding;
        dst->content.encoded.typeId = typeId;
        dst->content.encoded.body = UA_BYTESTRING_NULL;
    } else if(encoding == UA_EXTENSIONOBJECT_ENCODED_XML) {
        dst->encoding = (UA_ExtensionObjectEncoding)encoding;
        dst->content.encoded.typeId = typeId;
        retval = ByteString_decodeBinary(&dst->content.encoded.body);
    } else {
        retval = UA_STATUSCODE_BADDECODINGERROR;
    }
    return retval;
}